

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<wchar_t,fmt::v5::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          wchar_t value,basic_format_specs<wchar_t> *spec)

{
  char spec_00;
  int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> local_40;
  basic_format_specs<wchar_t> *local_20;
  basic_format_specs<wchar_t> *spec_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *pbStack_10;
  wchar_t value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  spec_00 = (spec->super_core_format_specs).type;
  local_20 = spec;
  spec_local._4_4_ = value;
  pbStack_10 = this;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::int_writer
            (&local_40,
             (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *
             )this,value,spec);
  internal::
  handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>>
            (spec_00,&local_40);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }